

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O3

string * google::protobuf::compiler::php::anon_unknown_2::BinaryToPhpString
                   (string *__return_storage_ptr__,string *src)

{
  byte bVar1;
  string *psVar2;
  uint uVar3;
  char cVar4;
  ulong uVar5;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  psVar2 = (string *)std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  if (src->_M_string_length != 0) {
    uVar5 = 0;
    do {
      bVar1 = (src->_M_dataplus)._M_p[uVar5];
      uVar3 = bVar1 - 0x22;
      cVar4 = (char)__return_storage_ptr__;
      if ((uVar3 < 0x3b) && ((0x400000000000005U >> ((ulong)uVar3 & 0x3f) & 1) != 0)) {
        std::__cxx11::string::push_back(cVar4);
      }
      else if (0x5e < (byte)(bVar1 - 0x20)) {
        std::__cxx11::string::push_back(cVar4);
        std::__cxx11::string::push_back(cVar4);
        std::__cxx11::string::push_back(cVar4);
      }
      psVar2 = (string *)std::__cxx11::string::push_back(cVar4);
      uVar5 = uVar5 + 1;
    } while (uVar5 < src->_M_string_length);
  }
  return psVar2;
}

Assistant:

std::string BinaryToPhpString(const std::string& src) {
  std::string dest;
  size_t i;
  unsigned char symbol[16] = {
      '0', '1', '2', '3', '4', '5', '6', '7',
      '8', '9', 'A', 'B', 'C', 'D', 'E', 'F',
  };

  dest.reserve(src.size() * 1.2);

  for (i = 0; i < src.size(); i++) {
    // To escape:
    // - escape sequences
    // - variable expansion: "hello $username";
    // - string termination
    if (src[i] == '\\' || src[i] == '$' || src[i] == '"') {
      dest += '\\';
      dest += src[i];
    } else if (absl::ascii_isprint(src[i])) {
      dest += src[i];
    } else {
      dest += '\\';
      dest += 'x';
      dest += symbol[(src[i] & 0xf0) >> 4];
      dest += symbol[src[i] & 0x0f];
    }
  }

  return dest;
}